

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O1

void wasm::
     CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
     ::doEndIf(RelevantLiveLocalsWalker *self,Expression **currp)

{
  pointer *pppBVar1;
  CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
  *this;
  long lVar2;
  char *__to;
  char *__to_00;
  
  this = (CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
          *)(self->
            super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            ).
            super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
            .currBasicBlock;
  startBasicBlock((CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                   *)self);
  link(this,(char *)(self->
                    super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                    ).
                    super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                    .currBasicBlock,__to);
  if ((*currp)->_id == IfId) {
    lVar2 = *(long *)(*currp + 2);
    link((CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
          *)(self->
            super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
            ).
            super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
            .ifLastBlockStack.
            super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1],
         (char *)(self->
                 super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                 ).
                 super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                 .currBasicBlock,__to_00);
    if (lVar2 != 0) {
      pppBVar1 = &(self->
                  super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                  ).
                  super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                  .ifLastBlockStack.
                  super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppBVar1 = *pppBVar1 + -1;
    }
    pppBVar1 = &(self->
                super_LivenessWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>_>
                ).
                super_CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>
                .ifLastBlockStack.
                super__Vector_base<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<RelevantLiveLocalsWalker,_wasm::Visitor<RelevantLiveLocalsWalker,_void>,_wasm::Liveness>::BasicBlock_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppBVar1 = *pppBVar1 + -1;
    return;
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x31b,"T *wasm::Expression::cast() [T = wasm::If]");
}

Assistant:

static void doEndIf(SubType* self, Expression** currp) {
    auto* last = self->currBasicBlock;
    self->startBasicBlock();
    // last one is ifFalse's fallthrough if there was one, otherwise it's the
    // ifTrue fallthrough
    self->link(last, self->currBasicBlock);
    if ((*currp)->cast<If>()->ifFalse) {
      // we just linked ifFalse, need to link ifTrue to the end
      self->link(self->ifLastBlockStack.back(), self->currBasicBlock);
      self->ifLastBlockStack.pop_back();
    } else {
      // no ifFalse, so add a fallthrough for if the if is not taken
      self->link(self->ifLastBlockStack.back(), self->currBasicBlock);
    }
    self->ifLastBlockStack.pop_back();
  }